

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBlock::FinalizeObject
          (LargeHeapBlock *this,Recycler *recycler,LargeObjectHeader *header)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  uchar uVar4;
  undefined4 *puVar5;
  
  if ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] != header
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x74f,"(this->HeaderList()[header->objectIndex] == header)",
                       "this->HeaderList()[header->objectIndex] == header");
    if (!bVar3) goto LAB_0065e6aa;
    *puVar5 = 0;
  }
  uVar4 = LargeObjectHeader::GetAttributes(header,this->heapInfo->recycler->Cookie);
  if (-1 < (char)uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x750,
                       "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)",
                       "header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit");
    if (!bVar3) {
LAB_0065e6aa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  (*(code *)**(undefined8 **)(header + 1))(header + 1,0);
  LargeObjectHeader::SetNext(header,this->heapInfo->recycler->Cookie,this->pendingDisposeObject);
  this->pendingDisposeObject = header;
  (&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] = (_func_int **)0x0;
  psVar1 = &this->heapInfo->pendingDisposableObjectCount;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void
LargeHeapBlock::FinalizeObject(Recycler* recycler, LargeObjectHeader* header)
{
    // The header count can also be null if this object has already been finalized
    // but this method should never be called if the header list header is null
    Assert(this->HeaderList()[header->objectIndex] == header);
    Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);

    // Call finalize to do clean up that needs to be done immediately
    // (e.g. Clear the ITrackable alias reference, so it can't be revived during
    // other finalizers or concurrent sweep)
    // Call it only if it hasn't already been finalized
    ((FinalizableObject *)header->GetAddress())->Finalize(false);
    header->SetNext(this->heapInfo->recycler->Cookie, this->pendingDisposeObject);
    this->pendingDisposeObject = header;

    // Null out the header in the header list- this means that this object has already
    // been finalized and is just pending dispose
    this->HeaderList()[header->objectIndex] = nullptr;

#ifdef RECYCLER_FINALIZE_CHECK
    this->heapInfo->pendingDisposableObjectCount++;
#endif
}